

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::TextureBarrierBasicOutline::iterate(TextureBarrierBasicOutline *this)

{
  TestLog *log;
  RenderContext *renderCtx;
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  ShaderProgram *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestError *pTVar5;
  int testPass;
  uint uVar6;
  GLuint i;
  uint uVar7;
  allocator<char> local_152;
  allocator<char> local_151;
  SharedPtr<glu::ShaderProgram> program;
  string local_140;
  string local_120;
  GLchar samplerName [12];
  long lVar4;
  
  log = ((this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx
        )->m_log;
  iVar2 = (*((this->super_TextureBarrierBaseTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TextureBarrierBaseTest).super_TestCase.m_context)->m_renderCtx;
  iVar2 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[5])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,(char *)CONCAT44(extraout_var_00,iVar2),&local_151);
  iVar2 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[6])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,(char *)CONCAT44(extraout_var_01,iVar2),&local_152);
  glu::makeVtxFragSources((ProgramSources *)samplerName,&local_120,&local_140);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)samplerName);
  de::SharedPtr<glu::ShaderProgram>::SharedPtr(&program,this_00);
  glu::ProgramSources::~ProgramSources((ProgramSources *)samplerName);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  glu::operator<<(log,program.m_ptr);
  if (((program.m_ptr)->m_program).m_info.linkOk == false) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureBarrierTests.cpp"
               ,0x1a0);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  *(deUint32 *)&(this->super_TextureBarrierBaseTest).field_0x7c =
       ((program.m_ptr)->m_program).m_program;
  (**(code **)(lVar4 + 0x1680))();
  for (iVar2 = 0; iVar2 != 8; iVar2 = iVar2 + 1) {
    builtin_memcpy(samplerName,"texInput",8);
    samplerName[9] = (char)iVar2 + '0';
    samplerName[8] = '[';
    samplerName[10] = ']';
    samplerName[0xb] = '\0';
    uVar3 = (**(code **)(lVar4 + 0xb48))
                      (*(undefined4 *)&(this->super_TextureBarrierBaseTest).field_0x7c,samplerName);
    (**(code **)(lVar4 + 0x14f0))(uVar3);
  }
  uVar6 = 0;
  do {
    iVar2 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
              _vptr_TestNode[8])(this);
    if (iVar2 <= (int)uVar6) {
      (**(code **)(lVar4 + 0x1680))(0);
      tcu::TestContext::setTestResult
                ((this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      de::SharedPtr<glu::ShaderProgram>::~SharedPtr(&program);
      return STOP;
    }
    initTextureData(this);
    uVar7 = 0;
    while( true ) {
      iVar2 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[9])(this);
      if (iVar2 <= (int)uVar7) break;
      (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[10])(this,(ulong)uVar6,(ulong)uVar7);
      render(this);
      iVar2 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[0xb])(this);
      if ((char)iVar2 != '\0') {
        (**(code **)(lVar4 + 0x13d0))();
      }
      uVar7 = uVar7 + 1;
    }
    uVar7 = 0;
    while( true ) {
      iVar2 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[9])(this);
      if (iVar2 <= (int)uVar7) break;
      (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[10])(this,(ulong)uVar6,(ulong)uVar7);
      (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
        _vptr_TestNode[7])(this);
      uVar7 = uVar7 + 1;
    }
    bVar1 = verifyTextureData(this);
    uVar6 = uVar6 + 1;
  } while (bVar1);
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Failed to validate rendering results",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureBarrierTests.cpp"
             ,0x1ce);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate()
	{
		tcu::TestLog&		  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();

		// Compile & link the program to use
		de::SharedPtr<glu::ShaderProgram> program(
			new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vsh(), fsh())));
		log << (*program);
		if (!program->isOk())
		{
			TCU_FAIL("Program compilation failed");
		}
		m_program = program->getProgram();

		gl.useProgram(m_program);

		for (GLuint i = 0; i < NUM_TEXTURES; ++i)
		{
			GLchar samplerName[] = "texInput[0]";
			samplerName[9]		 = static_cast<GLchar>('0' + i);
			GLint loc			 = gl.getUniformLocation(m_program, samplerName);
			gl.uniform1i(loc, i);
		}

		for (int testPass = 0; testPass < numTestPasses(); ++testPass)
		{
			// Initialize texture data at the beginning of each test pass
			initTextureData();

			// Perform rendering passes
			for (int renderPass = 0; renderPass < numRenderPasses(); ++renderPass)
			{
				// Setup render pass
				setupRenderPass(testPass, renderPass);

				// Render a set of primitives that cover each pixel of the framebuffer exactly once
				render();

				// If a TextureBarrier is needed insert it here
				if (needsBarrier())
					gl.textureBarrier();
			}

			// Update reference data after actual rendering to avoid bubbles
			for (int renderPass = 0; renderPass < numRenderPasses(); ++renderPass)
			{
				// Setup render pass
				setupRenderPass(testPass, renderPass);

				// Update reference data
				updateTextureData();
			}

			// Verify results at the end of each test pass
			if (!verifyTextureData())
			{
				TCU_FAIL("Failed to validate rendering results");
			}
		}

		gl.useProgram(0);

		// Test case passed
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}